

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O1

bool __thiscall Clasp::MovingAvg::push(MovingAvg *this,uint32 val)

{
  uint64 uVar1;
  uint uVar2;
  uint64 uVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_10;
  double local_8;
  
  uVar5 = *(uint *)&this->field_0x14;
  if ((uVar5 & 0x1fffffff) == 0) {
    uVar3 = (this->extra_).num;
    uVar1 = uVar3 + 1;
    (this->extra_).num = uVar1;
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar7 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * this->avg_ +
            (double)val) /
            ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  else {
    if ((uVar5 >> 0x1e & 1) == 0) {
      dVar7 = this->avg_;
      uVar6 = (ulong)this->pos_;
      uVar2 = (this->extra_).sma[uVar6];
      (this->extra_).sma[uVar6] = val;
      if ((uVar5 >> 0x1d & 1) == 0) {
        dVar7 = (dVar7 * (double)uVar6 + (double)val) / (double)(uVar6 + 1);
        goto LAB_0016fee3;
      }
      dVar8 = ((double)val - (double)uVar2) / (double)(uVar5 & 0x1fffffff);
    }
    else if ((uVar5 >> 0x1d & 1) == 0) {
      dVar8 = this->avg_;
      if (-1 < (int)uVar5) {
        dVar7 = (dVar8 * (double)this->pos_ + (double)val) / (double)((ulong)this->pos_ + 1);
        goto LAB_0016fee3;
      }
      local_10 = (this->extra_).alpha;
      if (this->pos_ < 0x20) {
        local_8 = (double)(0x3ff0000000000000 - ((ulong)this->pos_ << 0x34));
        pdVar4 = &local_10;
        if ((this->extra_).alpha < local_8) {
          pdVar4 = &local_8;
        }
      }
      else {
        pdVar4 = &local_10;
      }
      dVar7 = ((double)val - dVar8) * *pdVar4;
    }
    else {
      dVar8 = this->avg_;
      dVar7 = ((double)val - dVar8) * (this->extra_).alpha;
    }
    dVar7 = dVar7 + dVar8;
  }
LAB_0016fee3:
  this->avg_ = dVar7;
  uVar5 = this->pos_ + 1;
  this->pos_ = uVar5;
  if (uVar5 == (*(uint *)&this->field_0x14 & 0x1fffffff)) {
    this->pos_ = 0;
    *(uint *)&this->field_0x14 = *(uint *)&this->field_0x14 | 0x20000000;
  }
  return (bool)((this->field_0x17 & 0x20) >> 5);
}

Assistant:

bool push(uint32 val) {
		if      (!win_)   { avg_ = cma(avg_, val, extra_.num++); }
		else if (!ema_)   { avg_ = sma(avg_, val, extra_.sma, win_, pos_, valid()); }
		else if (valid()) { avg_ = ema(avg_, val, extra_.alpha); }
		else              { avg_ = smooth_ ? ema(avg_, val, smoothAlpha(extra_.alpha, pos_)) : cma(avg_, val, pos_); }
		if (++pos_ == win_) { pos_ = 0; full_ = 1; }
		return valid();
	}